

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O0

void __thiscall Bstrlib::CBString::insertchrs(CBString *this,int pos,int len,uchar cfill)

{
  int iVar1;
  CBStringException *this_00;
  allocator local_69;
  string local_68;
  undefined1 local_48 [8];
  CBStringException bstr__cppwrapper_exception;
  uchar cfill_local;
  int len_local;
  int pos_local;
  CBString *this_local;
  
  bstr__cppwrapper_exception.msg.field_2._M_local_buf[0xf] = cfill;
  iVar1 = binsertch(&this->super_tagbstring,pos,len,cfill);
  if (iVar1 == -1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_68,"CBString::Failure in insertchrs",&local_69);
    CBStringException::CBStringException((CBStringException *)local_48,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
    this_00 = (CBStringException *)__cxa_allocate_exception(0x28);
    CBStringException::CBStringException(this_00,(CBStringException *)local_48);
    __cxa_throw(this_00,&CBStringException::typeinfo,CBStringException::~CBStringException);
  }
  return;
}

Assistant:

void CBString::insertchrs (int pos, int len, unsigned char cfill) {
	if (BSTR_ERR == binsertch (this, pos, len, cfill)) {
		bstringThrow ("Failure in insertchrs");
	}
}